

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CreateReplacementVariables
          (ScalarReplacementPass *this,Instruction *inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Op OVar1;
  Instruction **ppIVar2;
  uint32_t uVar3;
  Instruction *type;
  Instruction *pIVar4;
  size_type sVar5;
  uint64_t uVar6;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  _Var7;
  uint32_t i;
  IRContext *this_00;
  uint uVar8;
  uint32_t elem;
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  components_used;
  _Any_data local_50;
  spv_opcode_table local_40;
  code *local_38;
  
  type = GetStorageType(this,inst);
  this_00 = (IRContext *)&components_used;
  GetUsedComponents((ScalarReplacementPass *)&components_used,(Instruction *)this);
  elem = 0;
  OVar1 = type->opcode_;
  if (OVar1 - OpTypeVector < 2) {
    uVar8 = 0;
    while( true ) {
      uVar6 = GetNumElements((ScalarReplacementPass *)this_00,type);
      if (uVar6 == uVar8) break;
      uVar3 = Instruction::GetSingleWordInOperand(type,0);
      this_00 = (IRContext *)this;
      CreateVariable(this,uVar3,inst,uVar8,replacements);
      uVar8 = uVar8 + 1;
    }
  }
  else if (OVar1 == OpTypeStruct) {
    local_50._8_8_ = (spv_operand_table)0x0;
    local_50._M_unused._M_object = operator_new(0x28);
    (((Instruction *)local_50._M_unused._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
    ._vptr_IntrusiveNodeBase = (_func_int **)this;
    (((Instruction *)local_50._M_unused._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
    .next_node_ = inst;
    (((Instruction *)local_50._M_unused._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
    .previous_node_ = (Instruction *)&elem;
    *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
     &(((Instruction *)local_50._M_unused._0_8_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = replacements;
    ((Instruction *)local_50._M_unused._0_8_)->context_ = (IRContext *)&components_used;
    local_38 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp:395:11)>
               ::_M_invoke;
    local_40 = (spv_opcode_table)
               std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp:395:11)>
               ::_M_manager;
    Instruction::ForEachInOperand(type,(function<void_(unsigned_int_*)> *)&local_50);
    if (local_40 != (spv_opcode_table)0x0) {
      (*(code *)local_40)(&local_50,&local_50,3);
    }
  }
  else {
    if (OVar1 != OpTypeArray) {
      __assert_fail("false && \"Unexpected type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                    ,0x1a8,
                    "bool spvtools::opt::ScalarReplacementPass::CreateReplacementVariables(Instruction *, std::vector<Instruction *> *)"
                   );
    }
    uVar8 = 0;
    while( true ) {
      pIVar4 = (Instruction *)GetArrayLength(this,type);
      if (pIVar4 == (Instruction *)(ulong)uVar8) break;
      if ((__uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
           )components_used._M_t.
            super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
            .
            super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
           )0x0) {
LAB_00186eb1:
        uVar3 = Instruction::GetSingleWordInOperand(type,0);
        CreateVariable(this,uVar3,inst,uVar8,replacements);
      }
      else {
        local_50._M_unused._M_object = (Instruction *)(ulong)uVar8;
        sVar5 = std::
                _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)components_used._M_t.
                           super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                           .
                           super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                           ._M_head_impl,(key_type_conflict1 *)local_50._M_pod_data);
        if (sVar5 != 0) goto LAB_00186eb1;
        uVar3 = Instruction::GetSingleWordInOperand(type,0);
        local_50._M_unused._M_object = GetUndef(this,uVar3);
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)replacements,(Instruction **)&local_50);
      }
      uVar8 = uVar8 + 1;
    }
  }
  TransferAnnotations(this,inst,replacements);
  local_50._M_unused._M_object = (void *)0x0;
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                    ((replacements->
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (replacements->
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  ppIVar2 = (replacements->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  std::
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  ::~unique_ptr(&components_used);
  return _Var7._M_current == ppIVar2;
}

Assistant:

bool ScalarReplacementPass::CreateReplacementVariables(
    Instruction* inst, std::vector<Instruction*>* replacements) {
  Instruction* type = GetStorageType(inst);

  std::unique_ptr<std::unordered_set<int64_t>> components_used =
      GetUsedComponents(inst);

  uint32_t elem = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeStruct:
      type->ForEachInOperand(
          [this, inst, &elem, replacements, &components_used](uint32_t* id) {
            if (!components_used || components_used->count(elem)) {
              CreateVariable(*id, inst, elem, replacements);
            } else {
              replacements->push_back(GetUndef(*id));
            }
            elem++;
          });
      break;
    case spv::Op::OpTypeArray:
      for (uint32_t i = 0; i != GetArrayLength(type); ++i) {
        if (!components_used || components_used->count(i)) {
          CreateVariable(type->GetSingleWordInOperand(0u), inst, i,
                         replacements);
        } else {
          uint32_t element_type_id = type->GetSingleWordInOperand(0);
          replacements->push_back(GetUndef(element_type_id));
        }
      }
      break;

    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeVector:
      for (uint32_t i = 0; i != GetNumElements(type); ++i) {
        CreateVariable(type->GetSingleWordInOperand(0u), inst, i, replacements);
      }
      break;

    default:
      assert(false && "Unexpected type.");
      break;
  }

  TransferAnnotations(inst, replacements);
  return std::find(replacements->begin(), replacements->end(), nullptr) ==
         replacements->end();
}